

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O3

void test_open_address_hashmap_simple_insert(planck_unit_test_t *tc)

{
  char cVar1;
  char *pcVar2;
  planck_unit_result_t pVar3;
  ion_err_t iVar4;
  ion_status_t iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ion_byte_t str [10];
  ion_hashmap_t map;
  uint local_88;
  int local_84;
  int local_80;
  char local_7a [10];
  long local_70;
  ion_hashmap_t local_68;
  
  local_68.super.key_type = key_type_numeric_signed;
  local_68.super.compare = dictionary_compare_signed_value;
  oah_initialize(&local_68,oah_compute_simple_hash,key_type_numeric_signed,4,10,10);
  if (0 < local_68.map_size) {
    local_70 = (long)local_68.super.record.key_size;
    local_80 = local_68.super.record.value_size + local_68.super.record.key_size + 1;
    iVar8 = 0;
    iVar7 = local_68.map_size;
    do {
      local_88 = 0;
      if (0 < iVar7) {
        uVar6 = 0;
        local_84 = iVar8;
        do {
          sprintf(local_7a,"%02i is key",uVar6);
          iVar5 = oah_insert(&local_68,&local_88,local_7a);
          if (((iVar8 == 0) || (local_68.write_concern == '\x02')) &&
             ((pVar3 = planck_unit_assert_true
                                 (tc,(uint)(iVar5.error == '\0'),0x119,
                                  "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                  ,"condition was false, expected true"), pVar3 == '\0' ||
              (pVar3 = planck_unit_assert_true
                                 (tc,(uint)(iVar5.count == 1),0x11a,
                                  "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                  ,"condition was false, expected true"), iVar8 = local_84,
              pVar3 == '\0')))) goto LAB_00101ba2;
          local_88 = local_88 + 1;
          uVar6 = (ulong)local_88;
        } while ((int)local_88 < local_68.map_size);
        local_88 = 0;
        iVar7 = local_68.map_size;
        if (0 < local_68.map_size) {
          do {
            pcVar2 = local_68.entry;
            uVar6 = (long)(int)(local_88 + iVar8) % (long)local_68.map_size;
            lVar9 = (long)(((int)uVar6 * local_80) % (local_68.map_size * local_80));
            cVar1 = local_68.entry[lVar9];
            sprintf(local_7a,"%02i is key",uVar6 & 0xffffffff);
            pVar3 = planck_unit_assert_true
                              (tc,(uint)(cVar1 == -3),0x127,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                               ,"condition was false, expected true");
            if (((pVar3 == '\0') ||
                (pVar3 = planck_unit_assert_true
                                   (tc,(uint)(*(int *)(pcVar2 + lVar9 + 1) ==
                                             (int)(local_88 + iVar8) % local_68.map_size),0x129,
                                    "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                    ,"condition was false, expected true"), pVar3 == '\0')) ||
               (pVar3 = planck_unit_assert_str_are_equal
                                  (tc,local_7a,pcVar2 + local_70 + lVar9 + 1,299,
                                   "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                                  ), pVar3 == '\0')) goto LAB_00101ba2;
            local_88 = local_88 + 1;
            iVar7 = local_68.map_size;
          } while ((int)local_88 < local_68.map_size);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar7);
  }
  iVar4 = oah_destroy(&local_68);
  pVar3 = planck_unit_assert_true
                    (tc,(uint)(iVar4 == '\0'),0x12f,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar3 != '\0') {
    return;
  }
LAB_00101ba2:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_insert(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i;
	int				offset;

	initialize_hash_map_std_conditions(&map);

	/*Manually populate records */
	ion_record_info_t record = map.super.record;

	/* manually populate array */
#if ION_DEBUG

	char *pos_ptr = map.entry;

#endif

	int bucket_size = sizeof(char) + record.key_size + record.value_size;

	for (offset = 0; offset < map.map_size; offset++) {
		/* apply continual offsets */
#if ION_DEBUG
		printf("entry loc: %p %p \n", map.entry, pos_ptr);
		pos_ptr = (map.entry + (offset * bucket_size) % (map.map_size * bucket_size));
#endif

		for (i = 0; i < map.map_size; i++) {
			/* build up the value */
			ion_byte_t str[10];

			sprintf((char *) str, "%02i is key", i);

			ion_status_t status = oah_insert(&map, (&i), str);	/* this is will wrap */

			if ((offset == 0) || (wc_duplicate == map.write_concern)) {
				PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
				PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
			}
		}

		for (i = 0; i < map.map_size; i++) {
			ion_record_status_t status	= ((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->status;
			ion_key_t			key		= (((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->data);
			ion_value_t			value	= (((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->data + record.key_size);

			/* build up expected value */
			ion_byte_t str[10];

			sprintf((char *) str, "%02i is key", (i + offset) % map.map_size);
			PLANCK_UNIT_ASSERT_TRUE(tc, status == ION_IN_USE);
			/* check to ensure key is pointing at correct location */
			PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) key == (i + offset) % map.map_size);
			/* While str and value are unsigned, equality test is signed, so casting required */
			PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) str, (char *) value);
		}
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}